

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3OpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  int iVar1;
  sqlite3_vtab_cursor *psVar2;
  
  psVar2 = (sqlite3_vtab_cursor *)sqlite3_malloc(0x80);
  *ppCsr = psVar2;
  if (psVar2 == (sqlite3_vtab_cursor *)0x0) {
    iVar1 = 7;
  }
  else {
    psVar2[0xe].pVtab = (sqlite3_vtab *)0x0;
    psVar2[0xf].pVtab = (sqlite3_vtab *)0x0;
    psVar2[0xc].pVtab = (sqlite3_vtab *)0x0;
    psVar2[0xd].pVtab = (sqlite3_vtab *)0x0;
    psVar2[10].pVtab = (sqlite3_vtab *)0x0;
    psVar2[0xb].pVtab = (sqlite3_vtab *)0x0;
    psVar2[8].pVtab = (sqlite3_vtab *)0x0;
    psVar2[9].pVtab = (sqlite3_vtab *)0x0;
    psVar2[6].pVtab = (sqlite3_vtab *)0x0;
    psVar2[7].pVtab = (sqlite3_vtab *)0x0;
    psVar2[4].pVtab = (sqlite3_vtab *)0x0;
    psVar2[5].pVtab = (sqlite3_vtab *)0x0;
    psVar2[2].pVtab = (sqlite3_vtab *)0x0;
    psVar2[3].pVtab = (sqlite3_vtab *)0x0;
    psVar2->pVtab = (sqlite3_vtab *)0x0;
    psVar2[1].pVtab = (sqlite3_vtab *)0x0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int fts3OpenMethod(sqlite3_vtab *pVTab, sqlite3_vtab_cursor **ppCsr){
  sqlite3_vtab_cursor *pCsr;               /* Allocated cursor */

  UNUSED_PARAMETER(pVTab);

  /* Allocate a buffer large enough for an Fts3Cursor structure. If the
  ** allocation succeeds, zero it and return SQLITE_OK. Otherwise, 
  ** if the allocation fails, return SQLITE_NOMEM.
  */
  *ppCsr = pCsr = (sqlite3_vtab_cursor *)sqlite3_malloc(sizeof(Fts3Cursor));
  if( !pCsr ){
    return SQLITE_NOMEM;
  }
  memset(pCsr, 0, sizeof(Fts3Cursor));
  return SQLITE_OK;
}